

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

FuncInfo * __thiscall
ByteCodeGenerator::StartBindFunction
          (ByteCodeGenerator *this,char16 *name,uint nameLength,uint shortNameOffset,
          bool *pfuncExprWithName,ParseNodeFnc *pnodeFnc,ParseableFunctionInfo *reuseNestedFunc)

{
  Type *pTVar1;
  Type TVar2;
  FncFlags FVar3;
  Utf8SourceInfo *this_00;
  ParseNodeBlock *pPVar4;
  ArenaAllocator *pAVar5;
  code *pcVar6;
  ParseNodeFnc *pPVar7;
  bool bVar8;
  ushort uVar9;
  charcount_t cVar10;
  Attributes AVar11;
  PropertyId PVar12;
  uint uVar13;
  undefined4 *puVar14;
  void *pvVar15;
  ParseableFunctionInfo *pPVar16;
  ByteBlock *pBVar17;
  FunctionInfo *pFVar18;
  FunctionBody *pFVar19;
  Symbol *sym;
  Scope *paramScope;
  Scope *bodyScope;
  FuncInfo *this_01;
  Attributes AVar20;
  char *pcVar21;
  FncFlags FVar22;
  char16 *key;
  Attributes AVar23;
  ByteCodeGenerator *pBVar24;
  Attributes AVar25;
  Scope *innerScope;
  char cVar26;
  undefined1 auVar27 [16];
  undefined1 local_68 [16];
  JavascriptMethod local_58;
  char16 *local_48;
  ByteCodeGenerator *local_40;
  ParseNodeFnc *local_38;
  
  local_48 = name;
  local_40 = this;
  local_38 = pnodeFnc;
  if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
    local_68 = (undefined1  [16])0x0;
    local_58 = (JavascriptMethod)0x0;
  }
  else {
    pFVar18 = (reuseNestedFunc->super_FunctionProxy).functionInfo.ptr;
    if (pFVar18 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
      pFVar18 = (reuseNestedFunc->super_FunctionProxy).functionInfo.ptr;
    }
    if ((ParseableFunctionInfo *)(pFVar18->functionBodyImpl).ptr != reuseNestedFunc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
      pFVar18 = (reuseNestedFunc->super_FunctionProxy).functionInfo.ptr;
    }
    local_58 = Js::FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar18);
    local_68._8_8_ = 0;
    local_68._0_8_ = reuseNestedFunc;
  }
  if ((local_40->pCurrentFunction == (FunctionBody *)0x0) ||
     (bVar8 = Js::ParseableFunctionInfo::IsFunctionParsed
                        (&local_40->pCurrentFunction->super_ParseableFunctionInfo), !bVar8)) {
    FVar3 = local_38->fncFlags;
    AVar11 = (int)(FVar3 * 8) >> 0x1f & (Async|ErrorOnNew);
    AVar20 = AVar11 | (Lambda|ErrorOnNew);
    if ((FVar3 >> 0xd & 1) == 0) {
      AVar20 = AVar11;
    }
    AVar20 = FVar3 >> 8 & SuperReference | AVar20;
    FVar22 = FVar3 & kFunctionIsClassConstructor;
    if ((FVar3 >> 0x14 & 1) == 0) {
      AVar11 = (FVar22 == kFunctionNone) + Method;
    }
    else if (FVar22 == kFunctionNone) {
      AVar20 = AVar20 | (ClassMethod|ErrorOnNew);
      AVar11 = Method|ErrorOnNew;
    }
    else {
      AVar20 = AVar20 + (FVar3 & kFunctionIsBaseClassConstructor) * 4 | ClassConstructor;
      AVar11 = Method;
    }
    AVar23 = FVar3 >> 6 & ErrorOnNew;
    auVar27._0_4_ = -(uint)((FVar3 & kFunctionHasComputedName) == kFunctionNone);
    auVar27._4_4_ = -(uint)((FVar3 & kFunctionHasNonSimpleParameterList) == kFunctionNone);
    auVar27._8_4_ = -(uint)((FVar3 & kFunctionIsGenerator) == kFunctionNone);
    auVar27._12_4_ = -(uint)((FVar3 & kFunctionIsMethod) == kFunctionNone);
    uVar13 = movmskps(AVar23,auVar27);
    if ((uVar13 & 8) != 0) {
      AVar11 = None;
    }
    AVar25 = (uint)((uVar13 & 2) == 0) << 0x1b | Generator;
    if ((uVar13 & 4) != 0) {
      AVar25 = None;
    }
    AVar11 = AVar11 | AVar20 | AVar25 | (FVar3 & kFunctionIsModule) << 7 | AVar23;
    AVar20 = AVar11 | CanDefer;
    if (local_38->canBeDeferred == false) {
      AVar20 = AVar11;
    }
    if (((uVar13 & 1) == 0) && (local_38->pnodeName == (ParseNodeVar *)0x0)) {
      AVar20 = AVar20 | ComputedName;
    }
    cVar26 = *pfuncExprWithName;
    AVar20 = (FVar3 & kFunctionHasHomeObj) << 4 | AVar20;
    pFVar19 = (FunctionBody *)reuseNestedFunc;
    if ((DAT_015933a0 == '\0') || (local_38->pnodeBody != (ParseNodePtr)0x0)) {
      if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
        pFVar19 = Js::FunctionBody::NewFromRecycler
                            (local_40->scriptContext,local_48,nameLength,shortNameOffset,
                             local_38->nestedCount,local_40->m_utf8SourceInfo,
                             ((((local_40->m_utf8SourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr
                             )->sourceContextId,local_38->functionId,AVar20,
                             (FunctionBodyFlags)(FVar22 >> 0xc) ^ Flags_HasNoExplicitReturnValue);
      }
      else {
        bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
        if (bVar8) {
          bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
          if (!bVar8) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                               ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
            if (!bVar8) goto LAB_00822e09;
            *puVar14 = 0;
          }
        }
        else {
          pFVar18 = (reuseNestedFunc->super_FunctionProxy).functionInfo.ptr;
          this_00 = (reuseNestedFunc->super_FunctionProxy).m_utf8SourceInfo.ptr;
          if (pFVar18 == (FunctionInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                               ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar8) goto LAB_00822e09;
            *puVar14 = 0;
            pFVar18 = (reuseNestedFunc->super_FunctionProxy).functionInfo.ptr;
          }
          Js::Utf8SourceInfo::StopTrackingDeferredFunction(this_00,pFVar18->functionId);
          pPVar16 = Js::FunctionProxy::GetParseableFunctionInfo
                              (&reuseNestedFunc->super_FunctionProxy);
          pFVar19 = Js::FunctionBody::NewFromParseableFunctionInfo(pPVar16);
          local_68._8_8_ = pFVar19;
        }
        pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar18 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar8) goto LAB_00822e09;
          *puVar14 = 0;
          pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        if ((FunctionBody *)(pFVar18->functionBodyImpl).ptr != pFVar19) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                             "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar8) goto LAB_00822e09;
          *puVar14 = 0;
          pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        if (((AVar20 ^ pFVar18->attributes) &
            (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|Module|Async
             |Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|ErrorOnNew)) != None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x57c,
                             "((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask))"
                             ,
                             "(parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask)"
                            );
          goto joined_r0x0082288a;
        }
      }
    }
    else if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
      pFVar19 = (FunctionBody *)
                Js::ParseableFunctionInfo::New
                          (local_40->scriptContext,local_38->nestedCount,local_38->functionId,
                           local_40->m_utf8SourceInfo,local_48,nameLength,shortNameOffset,AVar20,
                           (FunctionBodyFlags)(FVar22 >> 0xc) ^ Flags_HasNoExplicitReturnValue);
    }
    else {
      bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
      if (bVar8) {
        bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
        if (!bVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
          if (!bVar8) goto LAB_00822e09;
          *puVar14 = 0;
        }
        pBVar17 = Js::FunctionBody::GetByteCode((FunctionBody *)reuseNestedFunc);
        if (pBVar17 == (ByteBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x590,
                             "(!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr)"
                             ,
                             "!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr"
                            );
          if (!bVar8) goto LAB_00822e09;
          *puVar14 = 0;
        }
      }
      if (local_38->pnodeBody != (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x591,"(pnodeFnc->pnodeBody == nullptr)",
                           "pnodeFnc->pnodeBody == nullptr");
        if (!bVar8) goto LAB_00822e09;
        *puVar14 = 0;
      }
      pFVar18 = (reuseNestedFunc->super_FunctionProxy).functionInfo.ptr;
      if (pFVar18 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar8) goto LAB_00822e09;
        *puVar14 = 0;
        pFVar18 = (reuseNestedFunc->super_FunctionProxy).functionInfo.ptr;
      }
      if ((ParseableFunctionInfo *)(pFVar18->functionBodyImpl).ptr != reuseNestedFunc) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar8) goto LAB_00822e09;
        *puVar14 = 0;
        pFVar18 = (reuseNestedFunc->super_FunctionProxy).functionInfo.ptr;
      }
      if (((AVar20 ^ pFVar18->attributes) &
          (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|Module|Async|
           Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|ErrorOnNew)) != None) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x593,
                           "((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask))"
                           ,
                           "(parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask)"
                          );
joined_r0x0082288a:
        if (!bVar8) goto LAB_00822e09;
        *puVar14 = 0;
      }
    }
    Js::JavascriptLibrary::RegisterDynamicFunctionReference
              ((local_40->scriptContext->super_ScriptContextBase).javascriptLibrary,
               (FunctionProxy *)pFVar19);
    (pFVar19->super_ParseableFunctionInfo).deferredParseNextFunctionId =
         local_38->deferredParseNextFunctionId;
    uVar9 = (*(ushort *)&(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 &
            0xfffb) + ((ushort)local_38->fncFlags & 2) * 2;
    *(ushort *)&(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 = uVar9;
    (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 =
         (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0xdf |
         (byte)(local_38->fncFlags >> 0xc) & 0x20;
    uVar13 = (ushort)(short)local_38->fncFlags >> 3 & 8;
    *(ushort *)&(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
         uVar9 & 0xfff7 | (ushort)uVar13;
    if ((local_38->fncFlags & kFunctionIsAccessor) != kFunctionNone) {
      Js::ScriptContextOptimizationOverrideInfo::SetSideEffects
                (&local_40->scriptContext->optimizationOverrides,SideEffects_Accessor);
    }
  }
  else {
    cVar10 = Js::ParseableFunctionInfo::StartInDocument
                       (&local_40->pCurrentFunction->super_ParseableFunctionInfo);
    if (cVar10 != (local_38->super_ParseNode).ichMin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x534,"(this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin)",
                         "this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin");
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
      cVar10 = (local_38->super_ParseNode).ichMin;
    }
    pFVar19 = local_40->pCurrentFunction;
    if ((pFVar19->super_ParseableFunctionInfo).m_cchLength !=
        (local_38->super_ParseNode).ichLim - cVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x535,
                         "(this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints())"
                         ,
                         "this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints()"
                        );
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
      pFVar19 = local_40->pCurrentFunction;
    }
    Js::FunctionBody::RemoveDeferParseAttribute(pFVar19);
    pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar18 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
      pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar18->functionBodyImpl).ptr != pFVar19) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
      pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if (((pFVar18->attributes & DeferredParse) != None) &&
       (((pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x53c,
                         "(!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed())"
                         ,
                         "!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed()"
                        );
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
    }
    local_38->fncFlags =
         *(ushort *)&(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 1 &
         kFunctionDeclaration |
         local_38->fncFlags &
         (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|kFunctionHasDirectSuper|
          kFunctionIsAsync|kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|kFunctionIsGenerator|
          kFunctionIsStaticMember|kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
          kFunctionHasHomeObj|kFunctionIsClassMember|kFunctionIsBaseClassConstructor|
          kFunctionIsClassConstructor|kFunctionIsMethod|kFunctionHasSuperReference|
          kFunctionHasNonSimpleParameterList|kFunctionChildCallsEval|kFunctionIsLambda|
          kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
          kFunctionHasDestructuredParams|kFunctionStrictMode|kFunctionHasNonThisStmt|
          kFunctionIsAccessor|kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
          kFunctionUsesArguments|kFunctionCallsEval|kFunctionNested);
    if (local_38->canBeDeferred == false) {
      pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar18 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar8) goto LAB_00822e09;
        *puVar14 = 0;
        pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      if ((FunctionBody *)(pFVar18->functionBodyImpl).ptr != pFVar19) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar8) goto LAB_00822e09;
        *puVar14 = 0;
        pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      TVar2 = pFVar18->attributes;
      if ((FunctionBody *)(pFVar18->functionBodyImpl).ptr != pFVar19) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar8) goto LAB_00822e09;
        *puVar14 = 0;
        pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      pFVar18->attributes = TVar2 & ~CanDefer;
    }
    if (((((pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 4) == 0) &&
        ((local_38->fncFlags & kFunctionIsMethod) == kFunctionNone)) &&
       (local_38->pnodeName != (ParseNodeVar *)0x0)) {
      cVar26 = (local_38->pnodeName->super_ParseNode).nop == knopVarDecl;
    }
    else {
      cVar26 = false;
    }
    *pfuncExprWithName = (bool)cVar26;
    pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar18 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
      pFVar18 = (pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    pcVar21 = (char *)local_38;
    if ((pFVar18->functionId != local_38->functionId) &&
       ((bVar8 = Js::ScriptContext::IsScriptContextInNonDebugMode(local_40->scriptContext), bVar8 ||
        ((local_40->m_utf8SourceInfo->field_0xa8 & 4) != 0)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      pcVar21 = 
      "parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode()";
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x54a,
                         "(parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode())"
                         ,
                         "parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode()"
                        );
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
    }
    uVar13 = (uint)pcVar21;
    Js::FunctionBody::ResetByteCodeGenVisitState(pFVar19);
    pvVar15 = Js::FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar19,ScopeInfo);
    if (pvVar15 != (void *)0x0) {
      pvVar15 = Js::FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar19,ScopeInfo);
      if (((*(FunctionInfo **)((long)pvVar15 + 8) != (FunctionInfo *)0x0) &&
          (pPVar16 = Js::FunctionInfo::GetParseableFunctionInfo
                               (*(FunctionInfo **)((long)pvVar15 + 8)),
          pPVar16 != (ParseableFunctionInfo *)0x0)) &&
         ((pPVar16->flags & Flags_HasOrParentHasArguments) != Flags_None)) {
        pTVar1 = &(pFVar19->super_ParseableFunctionInfo).flags;
        *pTVar1 = *pTVar1 | Flags_HasOrParentHasArguments;
      }
    }
  }
  if (cVar26 == '\0') {
    innerScope = (Scope *)0x0;
  }
  else {
    innerScope = local_38->scope;
    if (innerScope == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      uVar13 = 0x10baf86;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x5b1,"(funcExprScope)","funcExprScope");
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
    }
    pBVar24 = local_40;
    PushScope(local_40,innerScope);
    sym = AddSymbolToScope(pBVar24,innerScope,key,uVar13,&local_38->pnodeName->super_ParseNode,
                           STFunction);
    sym->field_0x42 = sym->field_0x42 | 0x20;
    PVar12 = Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
                       (&pFVar19->super_ParseableFunctionInfo,&sym->name);
    sym->position = PVar12;
    ParseNodeFnc::SetFuncSymbol(local_38,sym);
    if ((*(ushort *)&innerScope->field_0x44 & 2) != 0) {
      *(ushort *)&innerScope->field_0x44 = *(ushort *)&innerScope->field_0x44 | 0x10;
    }
  }
  pPVar4 = local_38->pnodeScopes;
  if (pPVar4 == (ParseNodeBlock *)0x0) {
    paramScope = (Scope *)0x0;
  }
  else {
    paramScope = pPVar4->scope;
  }
  if (local_38->pnodeBodyScope == (ParseNodeBlock *)0x0) {
    bodyScope = (Scope *)0x0;
  }
  else {
    bodyScope = local_38->pnodeBodyScope->scope;
  }
  if (paramScope == (Scope *)0x0) {
    if (pPVar4 != (ParseNodeBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x5c3,"(paramScope != nullptr || !pnodeFnc->pnodeScopes)",
                         "paramScope != nullptr || !pnodeFnc->pnodeScopes");
      if (!bVar8) goto LAB_00822e09;
      *puVar14 = 0;
    }
    pBVar24 = local_40;
    paramScope = (Scope *)new<Memory::ArenaAllocator>(0x48,local_40->alloc,0x364470);
    pAVar5 = pBVar24->alloc;
    paramScope->enclosingScope = (Scope *)0x0;
    paramScope->scopeInfo = (ScopeInfo *)0x0;
    paramScope->location = 0xffffffff;
    paramScope->func = (FuncInfo *)0x0;
    paramScope->m_symList = (Symbol *)0x0;
    paramScope->m_count = 0;
    paramScope->alloc = pAVar5;
    paramScope->scopeSlotCount = 0;
    paramScope->innerScopeIndex = 0xffffffff;
    paramScope->scopeType = ScopeType_Parameter;
    *(ushort *)&paramScope->field_0x44 =
         (ushort)*(undefined4 *)&paramScope->field_0x44 & 0xf000 | 0x84;
    if (local_38->pnodeScopes != (ParseNodeBlock *)0x0) {
      local_38->pnodeScopes->scope = paramScope;
    }
  }
  pBVar24 = local_40;
  if (bodyScope == (Scope *)0x0) {
    bodyScope = (Scope *)new<Memory::ArenaAllocator>(0x48,local_40->alloc,0x364470);
    pAVar5 = pBVar24->alloc;
    bodyScope->enclosingScope = (Scope *)0x0;
    bodyScope->scopeInfo = (ScopeInfo *)0x0;
    bodyScope->location = 0xffffffff;
    bodyScope->func = (FuncInfo *)0x0;
    bodyScope->m_symList = (Symbol *)0x0;
    bodyScope->m_count = 0;
    bodyScope->alloc = pAVar5;
    bodyScope->scopeSlotCount = 0;
    bodyScope->innerScopeIndex = 0xffffffff;
    bodyScope->scopeType = ScopeType_FunctionBody;
    *(ushort *)&bodyScope->field_0x44 =
         (ushort)*(undefined4 *)&bodyScope->field_0x44 & 0xf000 | 0x84;
    if (local_38->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      local_38->pnodeBodyScope->scope = bodyScope;
    }
  }
  if ((local_38->super_ParseNode).nop != knopFncDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x5d5,"(pnodeFnc->nop == knopFncDecl)",
                       "Non-function declaration trying to create function body");
    if (!bVar8) goto LAB_00822e09;
    *puVar14 = 0;
  }
  pBVar24 = local_40;
  uVar9 = *(ushort *)&(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0xefff
  ;
  *(ushort *)&(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 = uVar9;
  if ((local_38->fncFlags & kFunctionStrictMode) != kFunctionNone) {
    *(ushort *)&(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
         uVar9 | 0x100;
  }
  this_01 = (FuncInfo *)new<Memory::ArenaAllocator>(0x300,local_40->alloc,0x364470);
  pPVar7 = local_38;
  FuncInfo::FuncInfo(this_01,local_48,pBVar24->alloc,pBVar24,paramScope,bodyScope,local_38,
                     &pFVar19->super_ParseableFunctionInfo);
  *(uint *)&this_01->field_0xb4 =
       *(uint *)&this_01->field_0xb4 & 0xfffeffff |
       (uint)(reuseNestedFunc != (ParseableFunctionInfo *)0x0) << 0x10;
  if ((pPVar7->fncFlags & kFunctionHasHeapArguments) != kFunctionNone) {
    FuncEscapes(local_40,bodyScope);
    FuncInfo::SetHasMaybeEscapedNestedFunc(this_01,L"ArgumentsObjectEscapes");
  }
  bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar19);
  if (bVar8) {
    bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar19);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar8) {
LAB_00822e09:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar14 = 0;
    }
    if (((pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0) {
      Js::FunctionBody::SaveState(pFVar19,local_38);
    }
    else {
      Js::FunctionBody::RestoreState(pFVar19,local_38);
    }
  }
  uVar13 = *(uint *)&this_01->field_0xb4 & 0xfffffffb | local_38->fncFlags >> 0xc & 4;
  *(uint *)&this_01->field_0xb4 = uVar13;
  if ((local_38->fncFlags & kFunctionCallsEval) != kFunctionNone) {
    *(uint *)&this_01->field_0xb4 = uVar13 | 2;
    bodyScope->field_0x44 = bodyScope->field_0x44 | 1;
    Scope::SetIsObject(bodyScope);
    bodyScope->field_0x44 = bodyScope->field_0x44 | 0x18;
    Scope::SetIsObject(paramScope);
    paramScope->field_0x44 = paramScope->field_0x44 | 0x18;
  }
  PushFuncInfo(local_40,L"StartBindFunction",this_01);
  if (innerScope != (Scope *)0x0) {
    innerScope->func = this_01;
    this_01->funcExprScope = innerScope;
  }
  if (local_40->maxAstSize < local_38->astSize) {
    local_40->maxAstSize = local_38->astSize;
  }
  local_68 = (undefined1  [16])0x0;
  if (local_38->isBodyAndParamScopeMerged == false) {
    this_01->field_0xb5 = this_01->field_0xb5 & 0x7f;
  }
  Js::AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)local_68);
  return this_01;
}

Assistant:

FuncInfo * ByteCodeGenerator::StartBindFunction(const char16 *name, uint nameLength, uint shortNameOffset, bool* pfuncExprWithName, ParseNodeFnc *pnodeFnc, Js::ParseableFunctionInfo * reuseNestedFunc)
{
    bool funcExprWithName;
    Js::ParseableFunctionInfo* parseableFunctionInfo = nullptr;

    Js::AutoRestoreFunctionInfo autoRestoreFunctionInfo(reuseNestedFunc, reuseNestedFunc ? reuseNestedFunc->GetOriginalEntryPoint_Unchecked() : nullptr);

    if (this->pCurrentFunction &&
        this->pCurrentFunction->IsFunctionParsed())
    {
        Assert(this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin);
        Assert(this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints());

        // This is the root function for the current AST subtree, and it already has a FunctionBody
        // (created by a deferred parse) which we're now filling in.
        Js::FunctionBody * parsedFunctionBody = this->pCurrentFunction;
        parsedFunctionBody->RemoveDeferParseAttribute();

        Assert(!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed());

        pnodeFnc->SetDeclaration(parsedFunctionBody->GetIsDeclaration());
        if (!pnodeFnc->CanBeDeferred())
        {
            parsedFunctionBody->SetAttributes(
                (Js::FunctionInfo::Attributes)(parsedFunctionBody->GetAttributes() & ~Js::FunctionInfo::Attributes::CanDefer));
        }
        funcExprWithName =
            !(parsedFunctionBody->GetIsDeclaration() || pnodeFnc->IsMethod()) &&
            pnodeFnc->pnodeName != nullptr &&
            pnodeFnc->pnodeName->nop == knopVarDecl;
        *pfuncExprWithName = funcExprWithName;

        Assert(parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode());

        // Some state may be tracked on the function body during the visit pass. Since the previous visit pass may have failed,
        // we need to reset the state on the function body.
        parsedFunctionBody->ResetByteCodeGenVisitState();

        if (parsedFunctionBody->GetScopeInfo())
        {
            // Propagate flags from the (real) parent function.
            Js::ParseableFunctionInfo *parent = parsedFunctionBody->GetScopeInfo()->GetParseableFunctionInfo();
            if (parent)
            {
                if (parent->GetHasOrParentHasArguments())
                {
                    parsedFunctionBody->SetHasOrParentHasArguments(true);
                }
            }
        }

        parseableFunctionInfo = parsedFunctionBody;
    }
    else
    {
        funcExprWithName = *pfuncExprWithName;
        Js::LocalFunctionId functionId = pnodeFnc->functionId;

        // Create a function body if:
        //  1. The parse node is not defer parsed
        //  2. Or creating function proxies is disallowed
        bool createFunctionBody = (pnodeFnc->pnodeBody != nullptr);
        if (!CONFIG_FLAG(CreateFunctionProxy)) createFunctionBody = true;

        const Js::FunctionInfo::Attributes attributes = GetFunctionInfoAttributes(pnodeFnc);

        if (createFunctionBody)
        {
            if (reuseNestedFunc)
            {
                if (!reuseNestedFunc->IsFunctionBody())
                {
                    reuseNestedFunc->GetUtf8SourceInfo()->StopTrackingDeferredFunction(reuseNestedFunc->GetLocalFunctionId());
                    Js::FunctionBody * parsedFunctionBody =
                        Js::FunctionBody::NewFromParseableFunctionInfo(reuseNestedFunc->GetParseableFunctionInfo());
                    autoRestoreFunctionInfo.funcBody = parsedFunctionBody;
                    parseableFunctionInfo = parsedFunctionBody;
                }
                else
                {
                    parseableFunctionInfo = reuseNestedFunc->GetFunctionBody();
                }
                Assert((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask));
            }
            else
            {
                parseableFunctionInfo = Js::FunctionBody::NewFromRecycler(scriptContext, name, nameLength, shortNameOffset, pnodeFnc->nestedCount, m_utf8SourceInfo,
                    m_utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId, functionId
                    , attributes
                    , pnodeFnc->IsClassConstructor() ?
                        Js::FunctionBody::FunctionBodyFlags::Flags_None :
                        Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
                    , false /* is function from deferred deserialized proxy */
#endif
                );
            }
        }
        else
        {
            if (reuseNestedFunc)
            {
                Assert(!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr);
                Assert(pnodeFnc->pnodeBody == nullptr);
                parseableFunctionInfo = reuseNestedFunc;
                Assert((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask));
            }
            else
            {
                parseableFunctionInfo = Js::ParseableFunctionInfo::New(scriptContext, pnodeFnc->nestedCount, functionId, m_utf8SourceInfo, name, nameLength, shortNameOffset, attributes,
                                        pnodeFnc->IsClassConstructor() ?
                                            Js::FunctionBody::FunctionBodyFlags::Flags_None :
                                            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue);
            }
        }

        // In either case register the function reference
        scriptContext->GetLibrary()->RegisterDynamicFunctionReference(parseableFunctionInfo);

#if DBG
        parseableFunctionInfo->deferredParseNextFunctionId = pnodeFnc->deferredParseNextFunctionId;
#endif
        parseableFunctionInfo->SetIsDeclaration(pnodeFnc->IsDeclaration() != 0);
        parseableFunctionInfo->SetIsMethod(pnodeFnc->IsMethod() != 0);
        parseableFunctionInfo->SetIsAccessor(pnodeFnc->IsAccessor() != 0);
        if (pnodeFnc->IsAccessor())
        {
            scriptContext->optimizationOverrides.SetSideEffects(Js::SideEffects_Accessor);
        }
    }

    Scope *funcExprScope = nullptr;
    if (funcExprWithName)
    {
        funcExprScope = pnodeFnc->scope;
        Assert(funcExprScope);
        PushScope(funcExprScope);
        Symbol *sym = AddSymbolToScope(funcExprScope, name, nameLength, pnodeFnc->pnodeName, STFunction);

        sym->SetIsFuncExpr(true);

        sym->SetPosition(parseableFunctionInfo->GetOrAddPropertyIdTracked(sym->GetName()));

        pnodeFnc->SetFuncSymbol(sym);

        if (funcExprScope->GetIsObject())
        {
            funcExprScope->SetMustInstantiate(true);
        }
    }

    Scope *paramScope = pnodeFnc->pnodeScopes ? pnodeFnc->pnodeScopes->scope : nullptr;
    Scope *bodyScope = pnodeFnc->pnodeBodyScope ? pnodeFnc->pnodeBodyScope->scope : nullptr;
    Assert(paramScope != nullptr || !pnodeFnc->pnodeScopes);
    if (paramScope == nullptr)
    {
        paramScope = Anew(alloc, Scope, alloc, ScopeType_Parameter, true);
        if (pnodeFnc->pnodeScopes)
        {
            pnodeFnc->pnodeScopes->scope = paramScope;
        }
    }
    if (bodyScope == nullptr)
    {
        bodyScope = Anew(alloc, Scope, alloc, ScopeType_FunctionBody, true);
        if (pnodeFnc->pnodeBodyScope)
        {
            pnodeFnc->pnodeBodyScope->scope = bodyScope;
        }
    }

    AssertMsg(pnodeFnc->nop == knopFncDecl, "Non-function declaration trying to create function body");

    parseableFunctionInfo->SetIsGlobalFunc(false);
    if (pnodeFnc->GetStrictMode() != 0)
    {
        parseableFunctionInfo->SetIsStrictMode();
    }

    FuncInfo *funcInfo = Anew(alloc, FuncInfo, name, alloc, this, paramScope, bodyScope, pnodeFnc, parseableFunctionInfo);

#if DBG
    funcInfo->isReused = (reuseNestedFunc != nullptr);
#endif

    if (pnodeFnc->GetArgumentsObjectEscapes())
    {
        // If the parser detected that the arguments object escapes, then the function scope escapes
        // and cannot be cached.
        this->FuncEscapes(bodyScope);
        funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("ArgumentsObjectEscapes")));
    }

    if (parseableFunctionInfo->IsFunctionBody())
    {
        Js::FunctionBody * parsedFunctionBody = parseableFunctionInfo->GetFunctionBody();
        if (parsedFunctionBody->IsReparsed())
        {
            parsedFunctionBody->RestoreState(pnodeFnc);
        }
        else
        {
            parsedFunctionBody->SaveState(pnodeFnc);
        }
    }

    funcInfo->SetChildCallsEval(!!pnodeFnc->ChildCallsEval());

    if (pnodeFnc->CallsEval())
    {
        funcInfo->SetCallsEval(true);

        bodyScope->SetIsDynamic(true);
        bodyScope->SetIsObject();
        bodyScope->SetCapturesAll(true);
        bodyScope->SetMustInstantiate(true);

        // Do not mark param scope as dynamic as it does not leak declarations
        paramScope->SetIsObject();
        paramScope->SetCapturesAll(true);
        paramScope->SetMustInstantiate(true);
    }

    PushFuncInfo(_u("StartBindFunction"), funcInfo);

    if (funcExprScope)
    {
        funcExprScope->SetFunc(funcInfo);
        funcInfo->funcExprScope = funcExprScope;
    }

    int32 currentAstSize = pnodeFnc->astSize;
    if (currentAstSize > this->maxAstSize)
    {
        this->maxAstSize = currentAstSize;
    }

    autoRestoreFunctionInfo.Clear();

    if (!pnodeFnc->IsBodyAndParamScopeMerged())
    {
        funcInfo->ResetBodyAndParamScopeMerged();
    }

    return funcInfo;
}